

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogDerivatives
          (BeagleCPUImpl<float,_1,_0> *this,int *postBufferIndices,int *preBufferIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,int *categoryWeightsIndices,
          int *categoryRatesIndices,int *cumulativeScaleIndices,int count,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  int *piVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  
  if (0 < count) {
    pfVar2 = this->gCategoryWeights[*categoryWeightsIndices];
    uVar10 = 0;
    pdVar8 = outSumDerivatives;
    pdVar9 = outSumSquaredDerivatives;
    do {
      pdVar5 = outDerivatives + (long)(int)uVar10 * (long)this->kPatternCount;
      if (outDerivatives == (double *)0x0) {
        pdVar5 = (double *)0x0;
      }
      pdVar6 = pdVar8;
      if (outSumDerivatives == (double *)0x0) {
        pdVar6 = outSumDerivatives;
      }
      pfVar3 = this->gPartials[preBufferIndices[uVar10]];
      piVar4 = this->gTipStates[postBufferIndices[uVar10]];
      uVar1 = firstDerivativeIndices[uVar10];
      pdVar7 = pdVar9;
      if (outSumSquaredDerivatives == (double *)0x0) {
        pdVar7 = outSumSquaredDerivatives;
      }
      (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x3c])(this);
      if (piVar4 == (int *)0x0) {
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x38])
                  (this,this->gPartials[postBufferIndices[uVar10]],pfVar3,(ulong)uVar1,0xffffffff,0,
                   pfVar2,0xffffffffffffffff,pdVar5,pdVar6,pdVar7);
      }
      else {
        (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x37])
                  (this,piVar4,pfVar3,(ulong)uVar1,0xffffffff,0,pfVar2,pdVar5,pdVar6,pdVar7);
      }
      (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x3d])(this,pdVar5,pdVar6,pdVar7);
      uVar10 = uVar10 + 1;
      pdVar9 = pdVar9 + 1;
      pdVar8 = pdVar8 + 1;
    } while ((uint)count != uVar10);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivatives(const int *postBufferIndices,
                                                              const int *preBufferIndices,
                                                              const int *firstDerivativeIndices,
                                                              const int *secondDerivativeIndices,
                                                              const int *categoryWeightsIndices,
                                                              const int *categoryRatesIndices,
                                                              const int *cumulativeScaleIndices,
                                                              int count,
                                                              double *outDerivatives,
                                                              double *outSumDerivatives,
                                                              double *outSumSquaredDerivatives) {

    int returnCode = BEAGLE_SUCCESS;

    const int secondDerivativeIndex = BEAGLE_OP_NONE;
    const double *categoryRates = NULL; // gCategoryRates[categoryRatesIndices[0]]; // TODO Generalize
    const REALTYPE *categoryWeights = gCategoryWeights[categoryWeightsIndices[0]]; // TODO Generalize

    for (int nodeNum = 0; nodeNum < count; nodeNum++) {

        const REALTYPE *preOrderPartial = gPartials[preBufferIndices[nodeNum]];
        const int *tipStates = gTipStates[postBufferIndices[nodeNum]];

        const int firstDerivativeIndex = firstDerivativeIndices[nodeNum];
        const int scalingFactorsIndex = -1; // cumulativeScaleIndices[nodeNum];

        const int patternOffset = nodeNum * kPatternCount;
        double* outDerivativesForNode = (outDerivatives == NULL) ?
                NULL : outDerivatives + patternOffset;
        double* outSumDerivativesForNode = (outSumDerivatives == NULL) ?
                NULL : outSumDerivatives + nodeNum;
        double* outSumSquaredDerivativesForNode = (outSumSquaredDerivatives == NULL) ?
                NULL : outSumSquaredDerivatives + nodeNum;

        resetDerivativeTemporaries();

        if (tipStates != NULL) {

            calcEdgeLogDerivativesStates(tipStates, preOrderPartial, firstDerivativeIndex,
                                        secondDerivativeIndex, categoryRates, categoryWeights,
                                        outDerivativesForNode,
                                        outSumDerivativesForNode,
                                        outSumSquaredDerivativesForNode);

        } else {

            const REALTYPE *postOrderPartial = gPartials[postBufferIndices[nodeNum]];
            calcEdgeLogDerivativesPartials(postOrderPartial, preOrderPartial, firstDerivativeIndex,
                                       secondDerivativeIndex, categoryRates, categoryWeights,
                                       scalingFactorsIndex,
                                       outDerivativesForNode,
                                       outSumDerivativesForNode,
                                       outSumSquaredDerivativesForNode);
        }

        accumulateDerivatives(outDerivativesForNode,
                outSumDerivativesForNode,
                outSumSquaredDerivativesForNode);

    }

    return returnCode;
}